

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

ByteData *
cfd::core::Psbt::CreateRecordKey
          (ByteData *__return_storage_ptr__,uint8_t type,ByteData *prefix,uint8_t sub_type,
          ByteData *sub_key_bytes)

{
  ByteData local_80;
  ByteData local_68;
  ByteData local_50;
  ByteData local_38;
  
  ByteData::ByteData(&local_38,type);
  ByteData::Serialize(&local_50,prefix);
  ByteData::ByteData(&local_68,sub_type);
  ByteData::Serialize(&local_80,sub_key_bytes);
  ByteData::Concat<cfd::core::ByteData,cfd::core::ByteData,cfd::core::ByteData>
            (__return_storage_ptr__,&local_38,&local_50,&local_68,&local_80);
  if (local_80.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_50.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData Psbt::CreateRecordKey(
    uint8_t type, const ByteData &prefix, uint8_t sub_type,
    const ByteData &sub_key_bytes) {
  return ByteData(type).Concat(
      prefix.Serialize(), ByteData(sub_type), sub_key_bytes.Serialize());
}